

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O2

int ompt_enumerate_states(int current_state,int *next_state,char **next_state_name)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 8;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x10 == 0x158) {
      return 0;
    }
    lVar1 = lVar2 + 0x10;
  } while (*(int *)((long)&ompt_state_info[0].state_name + lVar2) != current_state);
  *next_state = *(int *)((long)&ompt_state_info[1].state_name + lVar2);
  *next_state_name = *(char **)((long)&ompt_state_info[0].state_id + lVar2);
  return 1;
}

Assistant:

OMPT_API_ROUTINE int ompt_enumerate_states(int current_state, int *next_state,
                                           const char **next_state_name) {
  const static int len = sizeof(ompt_state_info) / sizeof(ompt_state_info_t);
  int i = 0;

  for (i = 0; i < len - 1; i++) {
    if (ompt_state_info[i].state_id == current_state) {
      *next_state = ompt_state_info[i + 1].state_id;
      *next_state_name = ompt_state_info[i + 1].state_name;
      return 1;
    }
  }

  return 0;
}